

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> * __thiscall
cmGeneratorTarget::GetUtilityItems(cmGeneratorTarget *this)

{
  bool bVar1;
  set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  cmGeneratorTarget *t;
  pair<std::_Rb_tree_const_iterator<cmLinkItem>,_bool> pVar2;
  cmListFileBacktrace local_110;
  string local_100;
  cmLinkItem local_e0;
  _Base_ptr local_a8;
  undefined1 local_a0;
  cmListFileBacktrace local_88;
  cmLinkItem local_78;
  cmGeneratorTarget *local_40;
  cmGeneratorTarget *gt;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *i;
  iterator __end2;
  iterator __begin2;
  set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *utilities;
  cmGeneratorTarget *this_local;
  
  if ((this->UtilityItemsDone & 1U) == 0) {
    this->UtilityItemsDone = true;
    this_00 = GetUtilities_abi_cxx11_(this);
    __end2 = std::
             set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(this_00);
    i = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        std::
        set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::end(this_00);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&i), bVar1) {
      gt = (cmGeneratorTarget *)
           std::
           _Rb_tree_const_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator*(&__end2);
      t = cmLocalGenerator::FindGeneratorTargetToUse(this->LocalGenerator,(string *)gt);
      local_40 = t;
      if (t == (cmGeneratorTarget *)0x0) {
        std::__cxx11::string::string((string *)&local_100,(string *)gt);
        cmListFileBacktrace::cmListFileBacktrace
                  (&local_110,(cmListFileBacktrace *)&gt->ObjectDirectory);
        cmLinkItem::cmLinkItem(&local_e0,&local_100,&local_110);
        std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
                  (&this->UtilityItems,&local_e0);
        cmLinkItem::~cmLinkItem(&local_e0);
        cmListFileBacktrace::~cmListFileBacktrace(&local_110);
        std::__cxx11::string::~string((string *)&local_100);
      }
      else {
        cmListFileBacktrace::cmListFileBacktrace
                  (&local_88,(cmListFileBacktrace *)&gt->ObjectDirectory);
        cmLinkItem::cmLinkItem(&local_78,t,&local_88);
        pVar2 = std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
                          (&this->UtilityItems,&local_78);
        local_a8 = (_Base_ptr)pVar2.first._M_node;
        local_a0 = pVar2.second;
        cmLinkItem::~cmLinkItem(&local_78);
        cmListFileBacktrace::~cmListFileBacktrace(&local_88);
      }
      std::
      _Rb_tree_const_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end2);
    }
  }
  return &this->UtilityItems;
}

Assistant:

std::set<cmLinkItem> const& cmGeneratorTarget::GetUtilityItems() const
{
  if (!this->UtilityItemsDone) {
    this->UtilityItemsDone = true;
    std::set<BT<std::string>> const& utilities = this->GetUtilities();
    for (BT<std::string> const& i : utilities) {
      if (cmGeneratorTarget* gt =
            this->LocalGenerator->FindGeneratorTargetToUse(i.Value)) {
        this->UtilityItems.insert(cmLinkItem(gt, i.Backtrace));
      } else {
        this->UtilityItems.insert(cmLinkItem(i.Value, i.Backtrace));
      }
    }
  }
  return this->UtilityItems;
}